

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::DoIt(string *subFolder,bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  bool bVar1;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  LoadPeriodToWeighting();
  LoadOccurrence();
  std::operator+(&path,"work/",subFolder);
  std::__cxx11::string::substr((ulong)&local_48,(ulong)&path);
  bVar1 = std::operator!=(&local_48,"/");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    std::operator+(&local_48,&path,"/");
    std::__cxx11::string::operator=((string *)&path,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ReadFilesInDirectory(&path);
  OutputRows(skipHeader,ordOutput,parquetOutFile);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void DoIt(const std::string& subFolder, const bool skipHeader,
	    const bool ordOutput, const std::string& parquetOutFile) {

    LoadPeriodToWeighting();
    LoadOccurrence();

    std::string path = "work/" + subFolder;
    if (path.substr(path.length() - 1, 1) != "/") {
      path = path + "/";
    }
    ReadFilesInDirectory(path);
    OutputRows(skipHeader, ordOutput, parquetOutFile);

  }